

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

size_t ON_FixedSizePool::DefaultElementCapacityFromSizeOfElement(size_t sizeof_element)

{
  ulong local_38;
  size_t page_count;
  size_t overhead;
  size_t page_size;
  size_t block_element_capacity;
  size_t sizeof_element_local;
  
  if (sizeof_element == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
               ,100,"","sizeof_element must be > 0");
    sizeof_element_local = 0;
  }
  else {
    overhead = ON_MemoryPageSize();
    if (overhead < 0x200) {
      overhead = 0x200;
    }
    local_38 = 1;
    page_size = (overhead - 0x30) / sizeof_element;
    do {
      if (999 < page_size) break;
      local_38 = local_38 * 2;
      page_size = (local_38 * overhead - 0x30) / sizeof_element;
    } while ((local_38 < 9) || (page_size < 0x41));
    sizeof_element_local = page_size;
  }
  return sizeof_element_local;
}

Assistant:

size_t ON_FixedSizePool::DefaultElementCapacityFromSizeOfElement(size_t sizeof_element)
{
  size_t block_element_capacity = 0;
  if (sizeof_element <= 0)
  {
    ON_ERROR("sizeof_element must be > 0");
    return 0;
  }

  size_t page_size = ON_MemoryPageSize();
  if (page_size < 512)
    page_size = 512;

  // The "overhead" is for the 2*sizeof(void*) ON_FixedSizePool uses at
  // the start of each block + 32 bytes extra for the heap manager
  // to keep the total allocation not exceeding multiple of page_size.
  const size_t overhead = 2 * sizeof(void*) + 32;

  size_t page_count = 1;
  block_element_capacity = (page_count * page_size - overhead) / sizeof_element;
  while (block_element_capacity < 1000)
  {
    page_count *= 2;
    block_element_capacity = (page_count * page_size - overhead) / sizeof_element;
    if (page_count > 8 && block_element_capacity > 64)
    {
      // for pools with large elements
      break;
    }
  }

  return block_element_capacity;
}